

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

void populate_unified_cost_update_freq(CostUpdateFreq cost_upd_freq,SPEED_FEATURES *sf)

{
  INTERNAL_COST_UPDATE_TYPE local_30;
  INTERNAL_COST_UPDATE_TYPE local_2c;
  INTERNAL_COST_UPDATE_TYPE local_28;
  INTERNAL_COST_UPDATE_TYPE local_24;
  INTER_MODE_SPEED_FEATURES *inter_sf;
  SPEED_FEATURES *sf_local;
  CostUpdateFreq cost_upd_freq_local;
  
  if ((sf->inter_sf).mv_cost_upd_level <
      populate_unified_cost_update_freq::map_cost_upd_to_internal_cost_upd
      [cost_upd_freq._8_8_ & 0xffffffff]) {
    local_24 = (sf->inter_sf).mv_cost_upd_level;
  }
  else {
    local_24 = populate_unified_cost_update_freq::map_cost_upd_to_internal_cost_upd
               [cost_upd_freq._8_8_ & 0xffffffff];
  }
  (sf->inter_sf).mv_cost_upd_level = local_24;
  if ((sf->inter_sf).coeff_cost_upd_level <
      populate_unified_cost_update_freq::map_cost_upd_to_internal_cost_upd
      [cost_upd_freq._0_8_ & 0xffffffff]) {
    local_28 = (sf->inter_sf).coeff_cost_upd_level;
  }
  else {
    local_28 = populate_unified_cost_update_freq::map_cost_upd_to_internal_cost_upd
               [cost_upd_freq._0_8_ & 0xffffffff];
  }
  (sf->inter_sf).coeff_cost_upd_level = local_28;
  cost_upd_freq_local.mode = cost_upd_freq.mode;
  if ((sf->inter_sf).mode_cost_upd_level <
      populate_unified_cost_update_freq::map_cost_upd_to_internal_cost_upd[cost_upd_freq_local.mode]
     ) {
    local_2c = (sf->inter_sf).mode_cost_upd_level;
  }
  else {
    local_2c = populate_unified_cost_update_freq::map_cost_upd_to_internal_cost_upd
               [cost_upd_freq_local.mode];
  }
  (sf->inter_sf).mode_cost_upd_level = local_2c;
  cost_upd_freq_local.dv = cost_upd_freq.dv;
  if ((sf->intra_sf).dv_cost_upd_level <
      populate_unified_cost_update_freq::map_cost_upd_to_internal_cost_upd[cost_upd_freq_local.dv])
  {
    local_30 = (sf->intra_sf).dv_cost_upd_level;
  }
  else {
    local_30 = populate_unified_cost_update_freq::map_cost_upd_to_internal_cost_upd
               [cost_upd_freq_local.dv];
  }
  (sf->intra_sf).dv_cost_upd_level = local_30;
  return;
}

Assistant:

static inline void populate_unified_cost_update_freq(
    const CostUpdateFreq cost_upd_freq, SPEED_FEATURES *const sf) {
  INTER_MODE_SPEED_FEATURES *const inter_sf = &sf->inter_sf;
  // Mapping of entropy cost update frequency from the encoder's codec control
  // settings of type COST_UPDATE_TYPE to speed features of type
  // INTERNAL_COST_UPDATE_TYPE.
  static const INTERNAL_COST_UPDATE_TYPE
      map_cost_upd_to_internal_cost_upd[NUM_COST_UPDATE_TYPES] = {
        INTERNAL_COST_UPD_SB, INTERNAL_COST_UPD_SBROW, INTERNAL_COST_UPD_TILE,
        INTERNAL_COST_UPD_OFF
      };

  inter_sf->mv_cost_upd_level =
      AOMMIN(inter_sf->mv_cost_upd_level,
             map_cost_upd_to_internal_cost_upd[cost_upd_freq.mv]);
  inter_sf->coeff_cost_upd_level =
      AOMMIN(inter_sf->coeff_cost_upd_level,
             map_cost_upd_to_internal_cost_upd[cost_upd_freq.coeff]);
  inter_sf->mode_cost_upd_level =
      AOMMIN(inter_sf->mode_cost_upd_level,
             map_cost_upd_to_internal_cost_upd[cost_upd_freq.mode]);
  sf->intra_sf.dv_cost_upd_level =
      AOMMIN(sf->intra_sf.dv_cost_upd_level,
             map_cost_upd_to_internal_cost_upd[cost_upd_freq.dv]);
}